

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

Player * __thiscall World::Login(World *this,string *username,secure_string *password)

{
  LoginReply LVar1;
  Player *this_00;
  string sStack_38;
  
  LVar1 = LoginCheck(this,username,password);
  if (LVar1 == LOGIN_WRONG_USERPASS) {
    this_00 = (Player *)0x0;
  }
  else {
    this_00 = (Player *)operator_new(0x80);
    std::__cxx11::string::string((string *)&sStack_38,(string *)username);
    Player::Player(this_00,&sStack_38,this);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return this_00;
}

Assistant:

Player *World::Login(const std::string& username, util::secure_string&& password)
{
	if (LoginCheck(username, std::move(password)) == LOGIN_WRONG_USERPASS)
		return 0;

	return new Player(username, this);
}